

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

void __thiscall re2c::Binary::Binary(Binary *this,Span *s,uint32_t n,State *next)

{
  Cond *this_00;
  If *pIVar1;
  allocator<char> local_51;
  string local_50;
  uint local_30;
  uint local_2c;
  uint32_t h;
  uint32_t l;
  State *next_local;
  Span *pSStack_18;
  uint32_t n_local;
  Span *s_local;
  Binary *this_local;
  
  this->cond = (Cond *)0x0;
  this->thn = (If *)0x0;
  this->els = (If *)0x0;
  local_2c = n >> 1;
  local_30 = n - local_2c;
  _h = next;
  next_local._4_4_ = n;
  pSStack_18 = s;
  s_local = (Span *)this;
  this_00 = (Cond *)operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<=",&local_51);
  Cond::Cond(this_00,&local_50,pSStack_18[local_2c - 1].ub - 1);
  this->cond = this_00;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar1 = (If *)operator_new(0x10);
  If::If(pIVar1,(uint)(local_2c < 5),pSStack_18,local_2c,_h);
  this->thn = pIVar1;
  pIVar1 = (If *)operator_new(0x10);
  If::If(pIVar1,(uint)(local_30 < 5),pSStack_18 + local_2c,local_30,_h);
  this->els = pIVar1;
  return;
}

Assistant:

Binary::Binary (const Span * s, uint32_t n, const State * next)
	: cond (NULL)
	, thn (NULL)
	, els (NULL)
{
	const uint32_t l = n / 2;
	const uint32_t h = n - l;
	cond = new Cond ("<=", s[l - 1].ub - 1);
	thn = new If (l > 4 ? If::BINARY : If::LINEAR, &s[0], l, next);
	els = new If (h > 4 ? If::BINARY : If::LINEAR, &s[l], h, next);
}